

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_options.hpp
# Opt level: O1

string_type * __thiscall
jsoncons::basic_json_options_common<wchar_t>::inf_to_num_abi_cxx11_
          (string_type *__return_storage_ptr__,basic_json_options_common<wchar_t> *this)

{
  pointer pwVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pwVar1 = (this->inf_to_num_)._M_dataplus._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)__return_storage_ptr__,pwVar1,pwVar1 + (this->inf_to_num_)._M_string_length)
  ;
  return __return_storage_ptr__;
}

Assistant:

string_type inf_to_num() const
    {
        if (enable_inf_to_num_)
        {
            return inf_to_num_;
        }
        else
        {
            return inf_to_num_; // empty string
        }
    }